

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall duckdb::ColumnReader::~ColumnReader(ColumnReader *this)

{
  ~ColumnReader(this);
  operator_delete(this);
  return;
}

Assistant:

ColumnReader::~ColumnReader() {
}